

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
binary_search_lower_bound<int>
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int l,int r,int *key)

{
  bool bVar1;
  int iVar2;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int mid;
  int local_28;
  int local_24;
  
  iVar2 = in_EDX;
  local_24 = in_ESI;
  while (local_28 = iVar2, local_24 < local_28) {
    iVar2 = local_24 + (local_28 - local_24) / 2;
    bVar1 = AlexCompare::operator()
                      (*(AlexCompare **)(in_RDI + 0x28),
                       (int *)(*(long *)(in_RDI + 0x48) + (long)iVar2 * 4),in_RCX);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_24 = iVar2 + 1;
      iVar2 = local_28;
    }
  }
  return local_24;
}

Assistant:

inline int binary_search_lower_bound(int l, int r, const K& key) const {
    while (l < r) {
      int mid = l + (r - l) / 2;
      if (key_greaterequal(ALEX_DATA_NODE_KEY_AT(mid), key)) {
        r = mid;
      } else {
        l = mid + 1;
      }
    }
    return l;
  }